

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall
QtMWidgets::MessageBox::MessageBox(MessageBox *this,QString *title,QString *text,QWidget *parent)

{
  MessageBoxPrivate *this_00;
  Object local_40 [8];
  code *local_38;
  undefined8 uStack_30;
  
  QDialog::QDialog(&this->super_QDialog,parent,0x40800);
  *(undefined ***)this = &PTR_metaObject_001a7708;
  *(undefined ***)&this->field_0x10 = &PTR__MessageBox_001a78e0;
  this_00 = (MessageBoxPrivate *)operator_new(0xa0);
  MessageBoxPrivate::MessageBoxPrivate(this_00,title,text,this,parent);
  (this->d).d = this_00;
  QWidget::setAttribute((ConnectionType)this,true);
  local_38 = _q_clicked;
  uStack_30 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::MessageBox::*)()>
            (local_40,(offset_in_QAbstractButton_to_subr)((this->d).d)->okButton,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  MessageBoxPrivate::adjustSize((this->d).d);
  return;
}

Assistant:

MessageBox::MessageBox( const QString & title,
	const QString & text, QWidget * parent )
	:	QDialog( parent, Qt::FramelessWindowHint | Qt::WindowStaysOnTopHint )
	,	d( new MessageBoxPrivate( title, text, this, parent ) )
{
	setAttribute( Qt::WA_MacAlwaysShowToolWindow, true );

	connect( d->okButton, &MsgBoxButton::clicked,
		this, &MessageBox::_q_clicked );

	d->adjustSize();
}